

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reap.c
# Opt level: O1

void reap_worker(void *unused)

{
  nni_cb p_Var1;
  size_t sVar2;
  nni_reap_node *pnVar3;
  nni_reap_list **ppnVar4;
  bool bVar5;
  nni_reap_node *pnVar6;
  nni_reap_list *pnVar7;
  
  nni_thr_set_name((nni_thr *)0x0,"nng:reap2");
  nni_mtx_lock(&reap_mtx);
  do {
    if (reap_list != (nni_reap_list *)0x0) {
      bVar5 = false;
      pnVar7 = reap_list;
      do {
        do {
          pnVar6 = pnVar7->rl_nodes;
          if (pnVar6 != (nni_reap_node *)0x0) {
            p_Var1 = pnVar7->rl_func;
            pnVar7->rl_nodes = (nni_reap_node *)0x0;
            sVar2 = pnVar7->rl_offset;
            nni_mtx_unlock(&reap_mtx);
            do {
              pnVar3 = pnVar6->rn_next;
              (*p_Var1)((void *)((long)pnVar6 - sVar2));
              pnVar6 = pnVar3;
            } while (pnVar3 != (nni_reap_node *)0x0);
            nni_mtx_lock(&reap_mtx);
            bVar5 = true;
          }
          ppnVar4 = &pnVar7->rl_next;
          pnVar7 = *ppnVar4;
        } while (*ppnVar4 != (nni_reap_list *)0x0);
        if (!bVar5) break;
        bVar5 = false;
        pnVar7 = reap_list;
      } while (reap_list != (nni_reap_list *)0x0);
    }
    reap_empty = 1;
    nni_cv_wake(&reap_empty_cv);
    if (reap_exit == '\x01') {
      nni_mtx_unlock(&reap_mtx);
      return;
    }
    nni_cv_wait(&reap_work_cv);
  } while( true );
}

Assistant:

static void
reap_worker(void *unused)
{
	NNI_ARG_UNUSED(unused);
	nni_thr_set_name(NULL, "nng:reap2");

	nni_mtx_lock(&reap_mtx);
	for (;;) {
		nni_reap_list *list;
		bool           reaped = false;

		for (list = reap_list; list != NULL; list = list->rl_next) {
			nni_reap_node *node;
			size_t         offset;
			nni_cb         func;

			if ((node = list->rl_nodes) == NULL) {
				continue;
			}

			reaped         = true;
			offset         = list->rl_offset;
			func           = list->rl_func;
			list->rl_nodes = NULL;

			// We process our list of nodes while not holding
			// the lock.
			nni_mtx_unlock(&reap_mtx);
			while (node != NULL) {
				void *ptr;
				ptr  = ((char *) node) - offset;
				node = node->rn_next;
				func(ptr);
			}
			nni_mtx_lock(&reap_mtx);
		}
		if (!reaped) {
			reap_empty = true;
			nni_cv_wake(&reap_empty_cv);
			if (reap_exit) {
				nni_mtx_unlock(&reap_mtx);
				return;
			}
			nni_cv_wait(&reap_work_cv);
		}
	}
}